

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

char * basename(char *__filename)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  *(char **)__filename = __filename + 0x10;
  __filename[8] = '\0';
  __filename[9] = '\0';
  __filename[10] = '\0';
  __filename[0xb] = '\0';
  __filename[0xc] = '\0';
  __filename[0xd] = '\0';
  __filename[0xe] = '\0';
  __filename[0xf] = '\0';
  __filename[0x10] = '\0';
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(in_RSI,"/\\",0xffffffffffffffff,2);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,0,
               *(size_type *)(__filename + 8),".",1);
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(in_RSI,"/\\",0xffffffffffffffff,2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,in_RSI,0,sVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
               &local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,"/");
  return __filename;
}

Assistant:

std::string basename(const std::string & filepath)
{
  std::string basedir;
  if (filepath.find_last_of("/\\") != std::string::npos) {
    basedir = filepath.substr(0, filepath.find_last_of("/\\"));
  } else {
    basedir = ".";
  }
#ifdef _WIN32
  basedir += "\\";
#else
  basedir += "/";
#endif
  return basedir;
}